

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

int __thiscall
ModelWriter::fwrite_weight_tag_data(ModelWriter *this,Mat *data,FILE *bp,float a,float b)

{
  float fVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t __n;
  uchar padding [4];
  int tag;
  Mat local_108;
  Mat local_b8;
  undefined4 local_64;
  Option local_60;
  
  lVar3 = ftell((FILE *)bp);
  ncnn::Mat::reshape(&local_b8,data,data->h * data->w * data->d * data->c,(Allocator *)0x0);
  if (this->gen_random_weight != 0) {
    Randomize(&local_b8,a,b);
  }
  if (local_b8.elemsize == 1) {
    local_108.data = (void *)CONCAT44(local_108.data._4_4_,0xd4b38);
LAB_0015d575:
    fwrite(&local_108,4,1,(FILE *)bp);
    __n = (size_t)local_b8.w;
  }
  else {
    if (local_b8.elemsize == 2) {
      local_108.data = (void *)CONCAT44(local_108.data._4_4_,0x1306b47);
      goto LAB_0015d575;
    }
    if (local_b8.elemsize != 4) {
      fprintf(_stderr,"unknown weight data type %d\n");
      goto LAB_0015d5a1;
    }
    if (this->storage_type == 1) {
      local_64 = 0x1306b47;
      fwrite(&local_64,4,1,(FILE *)bp);
      local_108.cstep = 0;
      local_108.data = (void *)0x0;
      local_108.refcount._0_4_ = 0;
      local_108.refcount._4_4_ = 0;
      local_108.elemsize._0_4_ = 0;
      local_108.elemsize._4_4_ = 0;
      local_108.elempack = 0;
      local_108.allocator = (Allocator *)0x0;
      local_108.dims = 0;
      local_108.w = 0;
      local_108.h = 0;
      local_108.d = 0;
      local_108.c = 0;
      ncnn::Option::Option(&local_60);
      ncnn::cast_float32_to_float16(&local_b8,&local_108,&local_60);
      fwrite(local_108.data,CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize),
             (long)local_108.w,(FILE *)bp);
      piVar2 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if (local_108.data != (void *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_108.cstep = 0;
      local_108.data = (void *)0x0;
      local_108.refcount._0_4_ = 0;
      local_108.refcount._4_4_ = 0;
      local_108.elemsize._0_4_ = 0;
      local_108.elemsize._4_4_ = 0;
      local_108.elempack = 0;
      local_108.dims = 0;
      local_108.w = 0;
      local_108.h = 0;
      local_108.d = 0;
      local_108.c = 0;
      goto LAB_0015d5a1;
    }
    local_108.data = (void *)((ulong)local_108.data._4_4_ << 0x20);
    fwrite(&local_108,4,1,(FILE *)bp);
    __n = (size_t)local_b8.w;
    if (__n != 0) {
      sVar5 = 0;
      do {
        fVar1 = *(float *)((long)local_b8.data + sVar5 * 4);
        if ((ABS(fVar1) < 1e-30) && ((fVar1 != 0.0 || (NAN(fVar1))))) {
          *(undefined4 *)((long)local_b8.data + sVar5 * 4) = 0;
        }
        sVar5 = sVar5 + 1;
      } while (__n != sVar5);
    }
  }
  fwrite(local_b8.data,local_b8.elemsize,__n,(FILE *)bp);
LAB_0015d5a1:
  lVar4 = ftell((FILE *)bp);
  lVar3 = (long)((int)lVar4 - (int)lVar3);
  local_108.data = (void *)((ulong)local_108.data & 0xffffffff00000000);
  fwrite(&local_108,1,(lVar3 + 3U & 0xfffffffffffffffc) - lVar3,(FILE *)bp);
  if (local_b8.refcount != (int *)0x0) {
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int ModelWriter::fwrite_weight_tag_data(const ncnn::Mat& data, FILE* bp, float a, float b)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.d * data.c);
    if (gen_random_weight)
        Randomize(data_flattened, a, b);

    if (data_flattened.elemsize == 4)
    {
        if (storage_type == 1)
        {
            const int tag = 0x01306B47; // fp16 magic
            fwrite(&tag, sizeof(int), 1, bp);
            ncnn::Mat data_flattened_fp16;
            ncnn::cast_float32_to_float16(data_flattened, data_flattened_fp16);
            fwrite(data_flattened_fp16.data, data_flattened_fp16.elemsize, data_flattened_fp16.w, bp);
        }
        else
        {
            const int tag = 0; // fp32 magic
            fwrite(&tag, sizeof(int), 1, bp);
            replace_denormals_with_zero(data_flattened, data_flattened.w);
            fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
        }
    }
    else if (data_flattened.elemsize == 2)
    {
        const int tag = 0x01306B47; // fp16 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else if (data_flattened.elemsize == 1)
    {
        const int tag = 0x000D4B38; // int8 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else
    {
        fprintf(stderr, "unknown weight data type %d\n", (int)data_flattened.elemsize);
    }

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    size_t nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}